

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry_bp.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  UserData data_00;
  N_Vector u_00;
  char *pcVar3;
  sunindextype mu;
  sunindextype ml;
  int jpre;
  int iout;
  int retval;
  void *cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  N_Vector u;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  SUNContext sunctx;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  char *funcname;
  void *in_stack_ffffffffffffff98;
  void *returnvalue;
  int local_5c;
  int local_58;
  sunrealtype sVar4;
  sunrealtype dx;
  double local_30;
  undefined1 local_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  dx = 0.0;
  sVar4 = 0.0;
  SUNContext_Create(0,&local_10);
  iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
  if (iVar1 == 0) {
    uVar2 = N_VNew_Serial(200,local_10);
    iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c);
    if (iVar1 == 0) {
      data_00 = (UserData)malloc(0x38);
      iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff8c);
      if (iVar1 == 0) {
        InitUserData(data_00);
        SetInitialProfiles((N_Vector)data_00,dx,sVar4);
        local_18 = 0x3f50624dd2f1a9fc;
        local_20 = 0x3ee4f8b588e368f1;
        sVar4 = (sunrealtype)CVodeCreate(2,local_10);
        iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff8c);
        if (iVar1 == 0) {
          CVodeSetUserData(sVar4,data_00);
          iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff8c);
          if (iVar1 == 0) {
            CVodeInit(0,sVar4,f,uVar2);
            iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
            if (iVar1 == 0) {
              CVodeSStolerances(local_20,local_18,sVar4);
              iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
              if (iVar1 == 0) {
                u_00 = (N_Vector)SUNLinSol_SPGMR(uVar2,1,0,local_10);
                iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                     in_stack_ffffffffffffff8c);
                if (iVar1 == 0) {
                  CVodeSetLinearSolver(sVar4,u_00,0);
                  iVar1 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                       in_stack_ffffffffffffff8c);
                  if (iVar1 == 0) {
                    funcname = (char *)0x2;
                    returnvalue = (void *)0x2;
                    CVBandPrecInit(sVar4,200,2,2);
                    iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff8c);
                    if (iVar1 == 0) {
                      PrintIntro((sunindextype)funcname,
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
                      for (local_5c = 1; local_5c < 3; local_5c = local_5c + 1) {
                        if (local_5c == 2) {
                          SetInitialProfiles((N_Vector)data_00,(sunrealtype)u_00,sVar4);
                          CVodeReInit(0,sVar4,uVar2);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff8c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          SUNLinSol_SPGMRSetPrecType(u_00,2);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff8c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          CVBandPrecInit(sVar4,200,funcname,returnvalue);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff8c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          printf("\n\n-------------------------------------------------------");
                          printf("------------\n");
                        }
                        pcVar3 = "SUN_PREC_RIGHT";
                        if (local_5c == 1) {
                          pcVar3 = "SUN_PREC_LEFT";
                        }
                        printf("\n\nPreconditioner type is:  jpre = %s\n\n",pcVar3);
                        local_30 = 7200.0;
                        for (local_58 = 1; local_58 < 0xd; local_58 = local_58 + 1) {
                          iVar1 = CVode(local_30,sVar4,uVar2,local_28,1);
                          check_retval(returnvalue,funcname,in_stack_ffffffffffffff8c);
                          PrintOutput(data_00,u_00,sVar4);
                          if (iVar1 != 0) break;
                          local_30 = local_30 + 7200.0;
                        }
                        PrintFinalStats(_iout);
                      }
                      N_VDestroy(uVar2);
                      free(data_00);
                      CVodeFree(&stack0xffffffffffffffb0);
                      SUNLinSolFree(u_00);
                      SUNContext_Free(&local_10);
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout, jpre;
  sunindextype ml, mu;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize u, and set problem data and tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Call CVBandPreInit to initialize band preconditioner */
  ml = mu = 2;
  retval  = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
  if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

  PrintIntro(mu, ml);

  /* Loop over jpre (= SUN_PREC_LEFT, SUN_PREC_RIGHT), and solve the problem */

  for (jpre = SUN_PREC_LEFT; jpre <= SUN_PREC_RIGHT; jpre++)
  {
    /* On second run, re-initialize u, the solver, and SPGMR */

    if (jpre == SUN_PREC_RIGHT)
    {
      SetInitialProfiles(u, data->dx, data->dy);

      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }

      retval = SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_RIGHT);
      if (check_retval(&retval, "SUNLinSol_SPGMRSetPrecType", 1))
      {
        return (1);
      }

      retval = CVBandPrecInit(cvode_mem, NEQ, mu, ml);
      if (check_retval(&retval, "CVBandPrecInit", 0)) { return (1); }

      printf("\n\n-------------------------------------------------------");
      printf("------------\n");
    }

    printf("\n\nPreconditioner type is:  jpre = %s\n\n",
           (jpre == SUN_PREC_LEFT) ? "SUN_PREC_LEFT" : "SUN_PREC_RIGHT");

    /* In loop over output points, call CVode, print results, test for error */

    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      PrintOutput(cvode_mem, u, t);
      if (retval != CV_SUCCESS) { break; }
    }

    /* Print final statistics */

    PrintFinalStats(cvode_mem);

  } /* End of jpre loop */

  /* Free memory */
  N_VDestroy(u);
  free(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}